

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

uint32_t __thiscall TldAsKey::Hash(TldAsKey *this)

{
  ulong local_18;
  size_t i;
  TldAsKey *this_local;
  
  if (this->hash == 0) {
    this->hash = 0xbabac001;
    for (local_18 = 0; local_18 < this->tld_len; local_18 = local_18 + 1) {
      this->hash = this->hash * 0x65 + (uint)this->tld[local_18];
    }
  }
  return this->hash;
}

Assistant:

uint32_t TldAsKey::Hash()
{
    if (hash == 0)
    {
        hash = 0xBABAC001;

        for (size_t i = 0; i < tld_len; i++)
        {
            hash = hash * 101 + tld[i];
        }
    }

    return hash;
}